

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_acceptor.h
# Opt level: O2

void __thiscall
cppcms::impl::cgi::
socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
::async_accept(socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
               *this)

{
  scgi *__p;
  shared_ptr<cppcms::impl::cgi::scgi> api;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_30;
  __shared_ptr<cppcms::impl::cgi::scgi,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  if (this->stopped_ == false) {
    __p = server_api_factory<cppcms::impl::cgi::scgi>::operator()
                    ((server_api_factory<cppcms::impl::cgi::scgi> *)&this->field_0x64,this->srv_);
    std::__shared_ptr<cppcms::impl::cgi::scgi,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppcms::impl::cgi::scgi,void>
              ((__shared_ptr<cppcms::impl::cgi::scgi,(__gnu_cxx::_Lock_policy)2> *)&local_28,__p);
    std::__shared_ptr<cppcms::impl::cgi::connection,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<cppcms::impl::cgi::connection,(__gnu_cxx::_Lock_policy)2> *)&this->api_
               ,&local_28);
    this->asio_socket_ = &(local_28._M_ptr)->socket_;
    booster::callback<void(std::error_code_const&)>::
    callback<cppcms::impl::cgi::socket_acceptor<cppcms::impl::cgi::scgi,cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>>::accept_binder>
              ((callback<void(std::error_code_const&)> *)&local_30,(accept_binder)this);
    booster::aio::acceptor::async_accept
              ((stream_socket *)&this->acceptor_,(callback *)&(local_28._M_ptr)->socket_);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  }
  return;
}

Assistant:

virtual void async_accept()
			{
				if(stopped_)
					return;
				booster::shared_ptr<ServerAPI> api(factory_(srv_));
				api_=api;
				asio_socket_ = &api->socket_;
				acceptor_.async_accept(*asio_socket_,accept_binder(this));
			}